

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPMacAlgorithm::signInit(OSSLEVPMacAlgorithm *this,SymmetricKey *key)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  uchar *key_00;
  size_t sVar4;
  undefined4 extraout_var;
  SymmetricKey *in_RSI;
  MacAlgorithm *in_RDI;
  ByteString dummy;
  ByteString *in_stack_ffffffffffffff88;
  ByteString *pBVar5;
  ByteString local_40;
  SymmetricKey *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = MacAlgorithm::signInit(in_RDI,in_RSI);
  if (bVar1) {
    pp_Var3 = (_func_int **)HMAC_CTX_new();
    in_RDI[1]._vptr_MacAlgorithm = pp_Var3;
    if (in_RDI[1]._vptr_MacAlgorithm == (_func_int **)0x0) {
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0x3a,"Failed to allocate space for HMAC_CTX");
      local_1 = 0;
    }
    else {
      ctx = (HMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
      (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
      key_00 = ByteString::const_byte_str(in_stack_ffffffffffffff88);
      (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
      sVar4 = ByteString::size((ByteString *)0x1b9f01);
      iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xc])();
      iVar2 = HMAC_Init_ex(ctx,key_00,(int)sVar4,(EVP_MD *)CONCAT44(extraout_var,iVar2),
                           (ENGINE *)0x0);
      if (iVar2 == 0) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                   ,0x42,"HMAC_Init failed");
        HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
        in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
        pBVar5 = &local_40;
        ByteString::ByteString((ByteString *)0x1b9f83);
        MacAlgorithm::signFinal(in_RDI,pBVar5);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1b9fa2);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPMacAlgorithm::signInit(const SymmetricKey* key)
{
	// Call the superclass initialiser
	if (!MacAlgorithm::signInit(key))
	{
		return false;
	}

	// Initialize the context
	curCTX = HMAC_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for HMAC_CTX");

		return false;
	}

	// Initialize EVP signing
	if (!HMAC_Init_ex(curCTX, key->getKeyBits().const_byte_str(), key->getKeyBits().size(), getEVPHash(), NULL))
	{
		ERROR_MSG("HMAC_Init failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}